

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

ON_BoundingBox * __thiscall
ON_SubDMeshFragmentIterator::SurfaceBoundingBox
          (ON_BoundingBox *__return_storage_ptr__,ON_SubDMeshFragmentIterator *this)

{
  element_type *peVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ON_BoundingBox *pOVar7;
  
  ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__);
  if (this->m_bFromFaceFragments == true) {
    ON_Geometry::GetTightBoundingBox
              (&(this->m_subd).super_ON_Geometry,__return_storage_ptr__,false,(ON_Xform *)0x0);
  }
  else {
    peVar1 = (this->m_limit_mesh).m_impl_sp.
             super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      pOVar7 = &ON_BoundingBox::EmptyBoundingBox;
    }
    else {
      pOVar7 = &peVar1->m_bbox;
    }
    dVar2 = (pOVar7->m_min).x;
    dVar3 = (pOVar7->m_min).y;
    dVar4 = (pOVar7->m_min).z;
    dVar5 = (pOVar7->m_max).x;
    dVar6 = (pOVar7->m_max).z;
    (__return_storage_ptr__->m_max).y = (pOVar7->m_max).y;
    (__return_storage_ptr__->m_max).z = dVar6;
    (__return_storage_ptr__->m_min).z = dVar4;
    (__return_storage_ptr__->m_max).x = dVar5;
    (__return_storage_ptr__->m_min).x = dVar2;
    (__return_storage_ptr__->m_min).y = dVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_SubDMeshFragmentIterator::SurfaceBoundingBox() const
{
  ON_BoundingBox bbox;
  if (m_bFromFaceFragments)
    m_subd.GetTightBoundingBox(bbox);
  else
    bbox = m_limit_mesh.BoundingBox();
  return bbox;
}